

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb_thrdpool.c
# Opt level: O3

_Bool uo_cb_thrdpool_init(void)

{
  undefined1 uVar1;
  int iVar2;
  
  uVar1 = 1;
  if (!is_init) {
    is_init = true;
    iVar2 = sem_init((sem_t *)&thrdpool.update_sem,0,0);
    is_init = (_Bool)(is_init & iVar2 == 0);
    thrdpool.is_paused = false;
    thrdpool.sample.completions = 0;
    thrdpool.thrd_count = 0;
    thrdpool.executing_count = 0;
    iVar2 = pthread_create(&thrdpool.manager_thrd,(pthread_attr_t *)0x0,uo_cb_manage_thrds,
                           (void *)0x0);
    is_init = iVar2 == 0;
    atexit(uo_cb_thrdpool_quit);
    uVar1 = is_init;
  }
  return (_Bool)uVar1;
}

Assistant:

bool uo_cb_thrdpool_init()
{
    if (is_init)
        return true;

    is_init = true;

    is_init &= sem_init(&thrdpool.update_sem, 0, 0) == 0;

    atomic_init(&thrdpool.is_paused, false);
    atomic_init(&thrdpool.thrd_count, 0);
    atomic_init(&thrdpool.executing_count, 0);
    atomic_init(&thrdpool.sample.completions, 0);

    is_init = pthread_create(&thrdpool.manager_thrd, NULL, uo_cb_manage_thrds, NULL) == 0;

    atexit(uo_cb_thrdpool_quit);

    return is_init;
}